

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O2

bool __thiscall
bssl::CertPathErrors::ContainsAnyErrorWithSeverity(CertPathErrors *this,Severity severity)

{
  pointer pCVar1;
  bool bVar2;
  vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_> *__range1;
  CertErrors *errors;
  pointer this_00;
  
  this_00 = (this->cert_errors_).
            super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (this->cert_errors_).
           super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pCVar1) {
      bVar2 = CertErrors::ContainsAnyErrorWithSeverity(&this->other_errors_,severity);
      return bVar2;
    }
    bVar2 = CertErrors::ContainsAnyErrorWithSeverity(this_00,severity);
    this_00 = this_00 + 1;
  } while (!bVar2);
  return true;
}

Assistant:

bool CertPathErrors::ContainsAnyErrorWithSeverity(
    CertError::Severity severity) const {
  for (const CertErrors &errors : cert_errors_) {
    if (errors.ContainsAnyErrorWithSeverity(severity)) {
      return true;
    }
  }

  if (other_errors_.ContainsAnyErrorWithSeverity(severity)) {
    return true;
  }

  return false;
}